

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O2

shared_sstring_view *
anon_unknown.dwarf_2a9f47::SStringViewArchive::make_shared_sstring_view
          (shared_sstring_view *__return_storage_ptr__,char *s)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_t __n;
  _func_int **__dest;
  __allocator_type __a2;
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<char_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_unittests_core_test_sstring_view_archive_cpp:63:61),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  __n = strlen(s);
  __dest = (_func_int **)operator_new__(__n);
  local_58._M_ptr = (element_type *)__dest;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_38._M_alloc = &__a2;
  (local_58._M_refcount._M_pi)->_M_use_count = 1;
  (local_58._M_refcount._M_pi)->_M_weak_count = 1;
  (local_58._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_0025aac8;
  local_58._M_refcount._M_pi[1]._vptr__Sp_counted_base = __dest;
  local_38._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<char_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sstring_view_archive.cpp:63:61),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  if (__n != 0) {
    memcpy(__dest,s,__n);
  }
  std::__shared_ptr<char_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<char,void>
            ((__shared_ptr<char_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,&local_58);
  _Var1._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  local_48 = (element_type *)0x0;
  __return_storage_ptr__->size_ = __n;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

shared_sstring_view SStringViewArchive::make_shared_sstring_view (char const * s) {
        auto const length = std::strlen (s);
        auto ptr = std::shared_ptr<char> (new char[length], [] (char * p) { delete[] p; });
        std::copy (s, s + length, ptr.get ());
        return {ptr, length};
    }